

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

void Nwk_ManGraphSolve(Nwk_Grf_t *p)

{
  long lVar1;
  long lVar2;
  Nwk_Vrt_t *pNVar3;
  Nwk_Vrt_t *pNext;
  
  Nwk_ManGraphPrepare(p);
LAB_003f2159:
  do {
    lVar2 = 0xf;
    if (p->pLists1[0] != 0) {
      __assert_fail("p->pLists1[0] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                    ,0x275,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
    }
    while (lVar2 != 0x1f) {
      lVar1 = lVar2 + -0xe;
      lVar2 = lVar2 + 1;
      if ((long)p->pLists1[lVar1] != 0) goto code_r0x003f2178;
    }
    if (p->pLists2[0] != 0) {
      __assert_fail("p->pLists2[0] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                    ,0x284,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
    }
    lVar2 = -0xf;
    if (p->pLists2[1] != 0) {
      __assert_fail("p->pLists2[1] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                    ,0x285,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
    }
    while( true ) {
      if (lVar2 == 0) {
        Nwk_ManGraphSortPairs(p);
        return;
      }
      if (p->pLists2[lVar2 + 0x11] != 0) break;
      lVar2 = lVar2 + 1;
    }
    pNVar3 = Nwk_ManGraphListFindMin(p,p->pLists2[lVar2 + 0x11]);
    if ((lVar2 != -1) && ((int)lVar2 - pNVar3->nEdges != -0x11)) {
      __assert_fail("pVertex->nEdges == j || j == NWK_MAX_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                    ,0x28c,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
    }
    pNext = Nwk_ManGraphListFindMinEdge(p,pNVar3);
    Nwk_ManGraphUpdate(p,pNVar3,pNext);
  } while( true );
code_r0x003f2178:
  pNVar3 = p->pVerts[p->pLists1[lVar1]];
  if (pNVar3->nEdges != 1) {
    __assert_fail("pVertex->nEdges == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                  ,0x27c,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
  }
  Nwk_ManGraphUpdate(p,pNVar3,p->pVerts[pNVar3[1].Id]);
  goto LAB_003f2159;
}

Assistant:

void Nwk_ManGraphSolve( Nwk_Grf_t * p )
{
    Nwk_Vrt_t * pVertex, * pNext;
    int i, j;
    Nwk_ManGraphPrepare( p );
    while ( 1 )
    {
        // find the next vertex to extract
        assert( p->pLists1[0] == 0 );
        for ( i = 1; i <= NWK_MAX_LIST; i++ )
            if ( p->pLists1[i] )
            {
//                printf( "%d ", i );
//                printf( "ListA = %2d. Length = %5d.\n", i, Nwk_ManGraphListLength(p,p->pLists1[i]) );
                pVertex = p->pVerts[ p->pLists1[i] ];
                assert( pVertex->nEdges == 1 );
                pNext = p->pVerts[ pVertex->pEdges[0] ];
                Nwk_ManGraphUpdate( p, pVertex, pNext );
                break;
            }
        if ( i < NWK_MAX_LIST + 1 )
            continue;
        // find the next vertex to extract
        assert( p->pLists2[0] == 0 );
        assert( p->pLists2[1] == 0 );
        for ( j = 2; j <= NWK_MAX_LIST; j++ )
            if ( p->pLists2[j] )
            {
//                printf( "***%d ", j );
//                printf( "ListB = %2d. Length = %5d.\n", j, Nwk_ManGraphListLength(p,p->pLists2[j]) );
                pVertex = Nwk_ManGraphListFindMin( p, p->pLists2[j] ); 
                assert( pVertex->nEdges == j || j == NWK_MAX_LIST );
                pNext = Nwk_ManGraphListFindMinEdge( p, pVertex );
                Nwk_ManGraphUpdate( p, pVertex, pNext );
                break;
            }
        if ( j == NWK_MAX_LIST + 1 )
            break;
    }
    Nwk_ManGraphSortPairs( p );
}